

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall
DReachabilityPropagator::_propagateReachability(DReachabilityPropagator *this,bool local)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  ostream *poVar7;
  byte in_SIL;
  DReachabilityPropagator *in_RDI;
  reference rVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  int ie;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  vec<Lit> ps_in;
  int last_incident;
  int in_deg;
  Clause *r_1;
  vector<bool,_std::allocator<bool>_> visited;
  int dom_u;
  int u;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<bool,_std::allocator<bool>_> falsev_1;
  vector<bool,_std::allocator<bool>_> v_1;
  vec<Lit> ps;
  Clause *r;
  int i_1;
  Clause *expl;
  vector<bool,_std::allocator<bool>_> falsev;
  vector<bool,_std::allocator<bool>_> v;
  vec<Lit> psfail;
  int i;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  int some_node;
  int reached;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffc00;
  Clause *in_stack_fffffffffffffc08;
  undefined1 learnt;
  undefined4 in_stack_fffffffffffffc10;
  Lit in_stack_fffffffffffffc14;
  undefined8 in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  undefined8 in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  Clause **r_00;
  int in_stack_fffffffffffffcf8;
  DReachabilityPropagator *in_stack_fffffffffffffd00;
  Reason local_230;
  int local_224;
  int local_220;
  uint local_21c;
  int *local_218;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_210;
  reference local_208;
  vec<Lit> local_200;
  uint local_1f0;
  int local_1ec;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  int local_1d4;
  Reason local_1d0;
  Clause *local_1c8;
  reference local_1c0;
  undefined8 local_1aa;
  uint local_180;
  uint local_17c;
  int *local_178;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_170;
  vector<int,_std::allocator<int>_> *local_168;
  Reason local_160;
  undefined1 local_151;
  undefined1 local_121;
  int local_f4;
  vec<Lit> local_f0;
  Clause *local_e0;
  uint local_d4;
  Clause *local_d0;
  undefined1 local_c1;
  undefined1 local_91;
  int local_68;
  int local_54;
  vec<Lit> local_50;
  uint local_3c;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  uint local_1c;
  int local_18;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  update_innodes((DReachabilityPropagator *)in_stack_fffffffffffffbf0._M_node);
  (*(in_RDI->lt->super_LengauerTarjan)._vptr_LengauerTarjan[1])();
  LengauerTarjan::DFS((LengauerTarjan *)0x2af809);
  iVar2 = FilteredLT::get_visited_innodes(in_RDI->lt);
  local_18 = iVar2;
  iVar3 = Tint::operator_cast_to_int(&in_RDI->in_nodes_tsize);
  if (iVar2 < iVar3) {
    if ((so.lazy & 1U) != 0) {
      local_1c = 0xffffffff;
      local_28 = &in_RDI->in_nodes_list;
      local_30._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_38 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffbf0._M_node,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        iVar3 = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
        if (!bVar1) break;
        puVar6 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&local_30);
        local_3c = *puVar6;
        uVar4 = (*(in_RDI->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                          (in_RDI->lt,(ulong)local_3c);
        if ((uVar4 & 1) == 0) {
          local_1c = local_3c;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_30);
      }
      vec<Lit>::vec(&local_50);
      get_root_idx(in_RDI);
      GraphPropagator::getNodeVar
                ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,in_stack_fffffffffffffbec);
      local_54 = (int)BoolView::getValLit((BoolView *)
                                          CONCAT44(in_stack_fffffffffffffbec,
                                                   in_stack_fffffffffffffbe8));
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffc00._pt,
                     (Lit *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      GraphPropagator::getNodeVar
                ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,in_stack_fffffffffffffbec);
      local_68 = (int)BoolView::getValLit((BoolView *)
                                          CONCAT44(in_stack_fffffffffffffbec,
                                                   in_stack_fffffffffffffbe8));
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffc00._pt,
                     (Lit *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      GraphPropagator::nbNodes((GraphPropagator *)0x2af9fa);
      local_91 = 0;
      std::allocator<bool>::allocator((allocator<bool> *)0x2afa31);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                 (size_type)in_stack_fffffffffffffc08,(bool *)in_stack_fffffffffffffc00._pt,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      std::allocator<bool>::~allocator((allocator<bool> *)0x2afa65);
      GraphPropagator::nbNodes((GraphPropagator *)0x2afa72);
      local_c1 = 0;
      std::allocator<bool>::allocator((allocator<bool> *)0x2afaa9);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                 (size_type)in_stack_fffffffffffffc08,(bool *)in_stack_fffffffffffffc00._pt,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      learnt = (undefined1)((ulong)in_stack_fffffffffffffc08 >> 0x38);
      std::allocator<bool>::~allocator((allocator<bool> *)0x2afadd);
      reverseDFStoBorder((DReachabilityPropagator *)
                         CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),iVar3,
                         (vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         in_stack_fffffffffffffc78,
                         (vec<Lit> *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                         iVar2);
      local_d0 = ::Clause_new<vec<Lit>>
                           ((vec<Lit> *)
                            CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                            (bool)learnt);
      *(uint *)local_d0 = *(uint *)local_d0 | 2;
      vec<vec<Clause_*>_>::last(&sat.rtrail);
      vec<Clause_*>::push((vec<Clause_*> *)in_stack_fffffffffffffc00._pt,
                          (Clause **)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      sat.confl = local_d0;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x2afba0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x2afbad);
      vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
    }
    local_1 = 0;
  }
  else {
    for (local_d4 = 0; uVar4 = local_d4,
        iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x2afca7), (int)uVar4 < iVar2;
        local_d4 = local_d4 + 1) {
      uVar4 = (*(in_RDI->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                        (in_RDI->lt,(ulong)local_d4);
      if ((uVar4 & 1) == 0) {
        GraphPropagator::getNodeVar
                  ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,in_stack_fffffffffffffbec);
        bVar1 = BoolView::isFixed((BoolView *)0x2afcf8);
        if (!bVar1) {
          local_e0 = (Clause *)0x0;
          if ((so.lazy & 1U) != 0) {
            vec<Lit>::vec(&local_f0);
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
            get_root_idx(in_RDI);
            GraphPropagator::getNodeVar
                      ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                       in_stack_fffffffffffffbec);
            local_f4 = (int)BoolView::getValLit((BoolView *)
                                                CONCAT44(in_stack_fffffffffffffbec,
                                                         in_stack_fffffffffffffbe8));
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffc00._pt,
                           (Lit *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            GraphPropagator::nbNodes((GraphPropagator *)0x2afdaf);
            local_121 = 0;
            std::allocator<bool>::allocator((allocator<bool> *)0x2afde6);
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                       (size_type)in_stack_fffffffffffffc08,(bool *)in_stack_fffffffffffffc00._pt,
                       (allocator_type *)
                       CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            std::allocator<bool>::~allocator((allocator<bool> *)0x2afe1a);
            GraphPropagator::nbNodes((GraphPropagator *)0x2afe27);
            local_151 = 0;
            std::allocator<bool>::allocator((allocator<bool> *)0x2afe5e);
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                       (size_type)in_stack_fffffffffffffc08,(bool *)in_stack_fffffffffffffc00._pt,
                       (allocator_type *)
                       CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            std::allocator<bool>::~allocator((allocator<bool> *)0x2afe92);
            reverseDFStoBorder((DReachabilityPropagator *)
                               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                               (vector<bool,_std::allocator<bool>_> *)
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                               in_stack_fffffffffffffc78,
                               (vec<Lit> *)
                               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
            local_e0 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)0x2afefa);
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)0x2aff07);
            vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
          }
          in_stack_fffffffffffffd00 =
               (DReachabilityPropagator *)
               GraphPropagator::getNodeVar
                         ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                          in_stack_fffffffffffffbec);
          Reason::Reason(&local_160,local_e0);
          BoolView::setVal((BoolView *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                           ,SUB81((ulong)in_stack_fffffffffffffbf0._M_node >> 0x38,0),
                           (Reason)in_stack_fffffffffffffc00);
          if ((local_11 & 1) != 0) {
            uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                              (in_RDI,(ulong)local_d4);
            if ((uVar4 & 1) == 0) {
              local_1 = 0;
              goto LAB_002b0996;
            }
            Tint::operator=((Tint *)CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                            (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          }
        }
      }
    }
    (*(in_RDI->lt->super_LengauerTarjan)._vptr_LengauerTarjan[3])();
    local_168 = &in_RDI->in_nodes_list;
    local_170._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_178 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffbf0._M_node,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      if (!bVar1) break;
      puVar6 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_170);
      local_17c = *puVar6;
      local_180 = (*(in_RDI->lt->super_LengauerTarjan)._vptr_LengauerTarjan[8])
                            (in_RDI->lt,(ulong)local_17c);
      if ((local_17c != local_180) && (local_180 != 0xffffffff)) {
        uVar4 = local_17c;
        uVar5 = get_root_idx(in_RDI);
        if (uVar4 != uVar5) {
          GraphPropagator::nbNodes((GraphPropagator *)0x2b0193);
          local_1aa._1_1_ = 0;
          r_00 = (Clause **)&local_1aa;
          std::allocator<bool>::allocator((allocator<bool> *)0x2b01ba);
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                     (size_type)in_stack_fffffffffffffc08,(bool *)in_stack_fffffffffffffc00._pt,
                     (allocator_type *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                    );
          std::allocator<bool>::~allocator((allocator<bool> *)0x2b01ee);
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                             (size_type)in_stack_fffffffffffffc08);
          local_1c0 = rVar8;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_1c0);
          if (bVar1) {
            poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_180);
            poVar7 = std::operator<<(poVar7," ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_17c);
            poVar7 = std::operator<<(poVar7," ");
            iVar2 = get_root_idx(in_RDI);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
            std::operator<<(poVar7,'\n');
          }
          local_1c8 = (Clause *)0x0;
          GraphPropagator::getNodeVar
                    ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,in_stack_fffffffffffffbec)
          ;
          bVar1 = BoolView::isFixed((BoolView *)0x2b0374);
          if (bVar1) {
LAB_002b04f1:
            GraphPropagator::getNodeVar
                      ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                       in_stack_fffffffffffffbec);
            bVar1 = BoolView::isFixed((BoolView *)0x2b051c);
            if (bVar1) {
              GraphPropagator::getNodeVar
                        ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                         in_stack_fffffffffffffbec);
              bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffbf0._M_node);
              if (bVar1) {
                local_1ec = 0;
                local_1f0 = 0xffffffff;
                vec<Lit>::vec(&local_200);
                if ((so.lazy & 1U) != 0) {
                  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
                }
                local_208 = std::
                            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ::operator[](&in_RDI->in,(long)(int)local_17c);
                local_210._M_current =
                     (int *)std::vector<int,_std::allocator<int>_>::begin
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                      );
                local_218 = (int *)std::vector<int,_std::allocator<int>_>::end
                                             ((vector<int,_std::allocator<int>_> *)
                                              CONCAT44(in_stack_fffffffffffffbec,
                                                       in_stack_fffffffffffffbe8));
                while( true ) {
                  bVar1 = __gnu_cxx::operator!=
                                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_stack_fffffffffffffbf0._M_node,
                                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                ));
                  if (!bVar1) break;
                  puVar6 = (uint *)__gnu_cxx::
                                   __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   ::operator*(&local_210);
                  local_21c = *puVar6;
                  GraphPropagator::getEdgeVar
                            ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                             in_stack_fffffffffffffbec);
                  bVar1 = BoolView::isFixed((BoolView *)0x2b0683);
                  if (bVar1) {
                    GraphPropagator::getEdgeVar
                              ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                               in_stack_fffffffffffffbec);
                    bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffbf0._M_node);
                    if (bVar1) goto LAB_002b06c8;
                    if ((so.lazy & 1U) != 0) {
                      GraphPropagator::getEdgeVar
                                ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                                 in_stack_fffffffffffffbec);
                      local_220 = (int)BoolView::getValLit((BoolView *)
                                                           CONCAT44(in_stack_fffffffffffffbec,
                                                                    in_stack_fffffffffffffbe8));
                      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffc00._pt,
                                     (Lit *)CONCAT17(in_stack_fffffffffffffbff,
                                                     in_stack_fffffffffffffbf8));
                    }
                  }
                  else {
LAB_002b06c8:
                    local_1ec = local_1ec + 1;
                    local_1f0 = local_21c;
                  }
                  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator++(&local_210);
                }
                if (local_1ec == 1) {
                  GraphPropagator::getEdgeVar
                            ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                             in_stack_fffffffffffffbec);
                  bVar1 = BoolView::isFixed((BoolView *)0x2b078e);
                  if (bVar1) goto LAB_002b091d;
                  if ((so.lazy & 1U) != 0) {
                    GraphPropagator::getNodeVar
                              ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                               in_stack_fffffffffffffbec);
                    in_stack_fffffffffffffc14 =
                         BoolView::getValLit((BoolView *)
                                             CONCAT44(in_stack_fffffffffffffbec,
                                                      in_stack_fffffffffffffbe8));
                    local_224 = in_stack_fffffffffffffc14.x;
                    vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffc00._pt,
                                   (Lit *)CONCAT17(in_stack_fffffffffffffbff,
                                                   in_stack_fffffffffffffbf8));
                    in_stack_fffffffffffffc08 =
                         Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
                    local_1c8 = in_stack_fffffffffffffc08;
                  }
                  in_stack_fffffffffffffc00._pt =
                       (Clause *)
                       GraphPropagator::getEdgeVar
                                 ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                                  in_stack_fffffffffffffbec);
                  Reason::Reason(&local_230,local_1c8);
                  BoolView::setVal((BoolView *)
                                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                                   SUB81((ulong)in_stack_fffffffffffffbf0._M_node >> 0x38,0),
                                   (Reason)in_stack_fffffffffffffc00);
                  if ((local_11 & 1) == 0) goto LAB_002b091d;
                  uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                                    (in_RDI,(ulong)local_1f0);
                  in_stack_fffffffffffffbff = (undefined1)uVar4;
                  if ((uVar4 & 1) != 0) {
                    pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffc14.x,
                                                in_stack_fffffffffffffc10),
                                       (value_type_conflict *)in_stack_fffffffffffffc08);
                    in_stack_fffffffffffffbf0 = pVar9.first._M_node;
                    in_stack_fffffffffffffbec =
                         CONCAT13(pVar9.second,(int3)in_stack_fffffffffffffbec);
                    Tint::operator=((Tint *)CONCAT44(in_stack_fffffffffffffc14.x,
                                                     in_stack_fffffffffffffc10),
                                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
                    goto LAB_002b091d;
                  }
                  local_1 = 0;
                  local_1d4 = 1;
                }
                else {
LAB_002b091d:
                  local_1d4 = 0;
                }
                vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffbf0._M_node);
                if (local_1d4 != 0) goto LAB_002b094f;
              }
            }
            local_1d4 = 0;
          }
          else {
            if ((so.lazy & 1U) != 0) {
              explain_dominator(in_stack_fffffffffffffd00,uVar4,in_stack_fffffffffffffcf8,r_00);
            }
            GraphPropagator::getNodeVar
                      ((GraphPropagator *)in_stack_fffffffffffffbf0._M_node,
                       in_stack_fffffffffffffbec);
            Reason::Reason(&local_1d0,local_1c8);
            BoolView::setVal((BoolView *)
                             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                             SUB81((ulong)in_stack_fffffffffffffbf0._M_node >> 0x38,0),
                             (Reason)in_stack_fffffffffffffc00);
            if ((local_11 & 1) == 0) goto LAB_002b04f1;
            add_innode((DReachabilityPropagator *)in_stack_fffffffffffffbf0._M_node,
                       in_stack_fffffffffffffbec);
            uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])
                              (in_RDI,(ulong)local_180);
            if ((uVar4 & 1) != 0) {
              Tint::operator=((Tint *)CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10
                                              ),(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
              pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffc14.x,in_stack_fffffffffffffc10),
                                 (value_type_conflict *)in_stack_fffffffffffffc08);
              local_1e8 = (_Base_ptr)pVar9.first._M_node;
              local_1e0 = pVar9.second;
              goto LAB_002b04f1;
            }
            local_1 = 0;
            local_1d4 = 1;
          }
LAB_002b094f:
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)0x2b095c);
          if (local_1d4 != 0) goto LAB_002b0996;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_170);
    }
    local_1 = 1;
  }
LAB_002b0996:
  return (bool)(local_1 & 1);
}

Assistant:

bool DReachabilityPropagator::_propagateReachability(bool local) {
	update_innodes();
	// cout <<"PROPAGATE REACHABILITY"<<endl;
	lt->init();
	lt->LengauerTarjan::DFS();
	const int reached = lt->get_visited_innodes();
	if (DEBUG) {
		std::cout << "Reached " << reached << " in_nodes_tsize " << in_nodes_tsize
							<< " in_nodes.size() " << in_nodes_list.size() << '\n';
	}

	if (reached < in_nodes_tsize) {
		// FAIL because of not reaching some other node
		if (so.lazy) {
			int some_node = -1;
			for (const int i : in_nodes_list) {
				if (!lt->visited_dfs(i)) {
					some_node = i;
				}
			}
			assert(some_node != -1);
			vec<Lit> psfail;
			psfail.push(getNodeVar(get_root_idx()).getValLit());
			assert(getNodeVar(some_node).isFixed() && getNodeVar(some_node).isTrue());
			psfail.push(getNodeVar(some_node).getValLit());
			std::vector<bool> v(nbNodes(), false);
			std::vector<bool> falsev(nbNodes(), false);
			reverseDFStoBorder(some_node, v, falsev, psfail);
			if (DEBUG) {
				std::cout << "Expl size: " << psfail.size() << '\n';
			}
			Clause* expl = Clause_new(psfail);
			expl->temp_expl = 1;
			sat.rtrail.last().push(expl);
			sat.confl = expl;
		}
		return false;
	}
	//*
	for (int i = 0; i < nbNodes(); i++) {
		if (!lt->visited_dfs(i) && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(get_root_idx()).getValLit());
				std::vector<bool> v(nbNodes(), false);
				std::vector<bool> falsev(nbNodes(), false);
				reverseDFStoBorder(i, v, falsev, ps);
				r = Reason_new(ps);
			}
			getNodeVar(i).setVal(false, r);
			if (local) {
				if (!propagateRemNode(i)) {
					return false;
				}
				last_state_n[i] = VT_OUT;
			}
		}
	}  //*/

	lt->find_doms();
	// for (int i = 0; i < nbNodes(); i++)
	//     cerr <<"("<<i <<","<< lt->dominator(i)<<") ";
	// cerr<<endl;

	for (const int u : in_nodes_list) {
		assert(getNodeVar(u).isFixed());
		assert(getNodeVar(u).isTrue());
		if (DEBUG) {
			std::cout << "Looking at innode? u: " << u << " " << getNodeVar(u).isFixed() << '\n';
		}
		const int dom_u = lt->dominator(u);

		if (u == dom_u || dom_u == -1) {  // At the root
			continue;
		}
		if (u == get_root_idx()) {
			continue;
		}

		std::vector<bool> visited = std::vector<bool>(nbNodes(), false);
		if (DEBUG) {
			std::cout << "STARTING DFS (avoid " << dom_u << ")" << '\n';
			std::cout << "Nodes: ";
			for (int i = 0; i < nbNodes(); i++) {
				std::cout << i << "("
									<< (getNodeVar(i).isFixed() ? (getNodeVar(i).isTrue() ? "I" : "O") : "U") << "),";
			}
			std::cout << '\n';
			std::cout << "Edges: ";
			for (int i = 0; i < nbEdges(); i++) {
				std::cout << i << "[" << getTail(i) << "," << getHead(i) << "]"
									<< "(" << (getEdgeVar(i).isFixed() ? (getEdgeVar(i).isTrue() ? "I" : "O") : "U")
									<< "),";
			}
			std::cout << '\n';
		}
		assert(correctDominator(get_root_idx(), visited, dom_u));
		if (visited[u]) {
			std::cout << dom_u << " " << u << " " << get_root_idx() << '\n';
		}
		assert(!visited[u]);

		Clause* r = nullptr;

		if (!getNodeVar(dom_u).isFixed()) {
			// Fix the dominator
			//*
			if (so.lazy) {
				explain_dominator(u, dom_u, &r);
			}

			if (DEBUG) {
				std::cout << "Adding innode " << __FILE__ << __LINE__ << "(" << dom_u << " dominates " << u
									<< ")" << '\n';
			}
			getNodeVar(dom_u).setVal(true, r);
			if (local) {
				add_innode(dom_u);
				if (!propagateNewNode(dom_u)) {
					return false;
				}
				last_state_n[dom_u] = VT_IN;
				new_node.insert(dom_u);
			}
			//*/
		}

		if (getNodeVar(dom_u).isFixed() && getNodeVar(dom_u).isTrue()) {
			// Find bridge if any and enforce its endpoints
			int in_deg = 0;
			int last_incident = -1;
			vec<Lit> ps_in;
			if (so.lazy) {
				ps_in.push();
			}
			for (const int ie : in[u]) {
				if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
					in_deg++;
					last_incident = ie;
				} else if (so.lazy) {
					ps_in.push(getEdgeVar(ie).getValLit());
				}
			}
			if (in_deg == 1 && !getEdgeVar(last_incident).isFixed()) {
				//*
				if (so.lazy) {
					// ps_in.push(getNodeVar(dom_u).getValLit());
					ps_in.push(getNodeVar(u).getValLit());
					r = Reason_new(ps_in);
				}
				getEdgeVar(last_incident).setVal(true, r);
				if (local) {
					if (!propagateNewEdge(last_incident)) {
						return false;
					}
					if (DEBUG) {
						std::cout << "Adding inedge " << last_incident << " " << __FILE__ << __LINE__ << "("
											<< dom_u << " dominates " << u << ")" << '\n';
					}
					new_edge.insert(last_incident);
					last_state_e[last_incident] = VT_IN;
				}
				//*/
			}
		}
	}

	return true;
}